

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void verb_prog_antava_touch_hand(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  char *txt;
  allocator<char> local_246;
  allocator<char> local_245;
  int local_244;
  void *local_240;
  void *local_238;
  CHAR_DATA *ch_local;
  ROOM_INDEX_DATA *tomb;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  ch_local = ch;
  tomb = get_room_index(0x66);
  if (ch->in_room->vnum != 0x1ce) {
    return;
  }
  if (ch->fighting == (CHAR_DATA *)0x0) {
    if (6 < ch->position) {
      act("You touch the hand of the decaying statue.",ch,(void *)0x0,(void *)0x0,3);
      act("$n reaches up and touches the hand of the decaying statue.",ch,(void *)0x0,(void *)0x0,0)
      ;
      act("A rusty clicking noise begins to sound from within the statue.",(CHAR_DATA *)0x0,
          (void *)0x0,(void *)0x0,0);
      if (ch->in_room->vnum != 0x1ce) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"verb_prog_antava_touch_hand",&local_245);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"act_queue",&local_246)
      ;
      local_238 = (void *)0x0;
      local_240 = (void *)0x0;
      local_244 = 3;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[84],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,0xe,&local_40,&local_60,act_queue,
                 (char (*) [84])
                 "Darkness closes back in upon the antechamber as the stone above you shuts abruptly!"
                 ,&ch_local,&local_238,&local_240,&local_244);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"verb_prog_antava_touch_hand",(allocator<char> *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"do_look_queue",(allocator<char> *)&local_240);
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[5]>
                (&RS.Queue,9,&local_80,&local_a0,do_look_queue,&ch_local,(char (*) [5])"auto");
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"verb_prog_antava_touch_hand",&local_245);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"act_queue",&local_246)
      ;
      local_238 = (void *)0x0;
      local_240 = (void *)0x0;
      local_244 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[36],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_c0,&local_e0,act_queue,
                 (char (*) [36])"$n suddenly slides down from above!",&ch_local,&local_238,
                 &local_240,&local_244);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"verb_prog_antava_touch_hand",(allocator<char> *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"char_to_room",(allocator<char> *)&local_240);
      CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                (&RS.Queue,9,&local_100,&local_120,char_to_room,&ch_local,&tomb);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"verb_prog_antava_touch_hand",(allocator<char> *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"char_from_room",(allocator<char> *)&local_240);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,9,&local_140,&local_160,char_from_room,&ch_local);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"verb_prog_antava_touch_hand",&local_245);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"act_queue",&local_246);
      local_238 = (void *)0x0;
      local_240 = (void *)0x0;
      local_244 = 3;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[54],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_180,&local_1a0,act_queue,
                 (char (*) [54])"You suddenly feel the ground drop out from under you!",&ch_local,
                 &local_238,&local_240,&local_244);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"verb_prog_antava_touch_hand",&local_245);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"act_queue",&local_246);
      local_238 = (void *)0x0;
      local_240 = (void *)0x0;
      local_244 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,9,&local_1c0,&local_1e0,act_queue,
                 (char (*) [79])
                 "The sound of grinding granite fills the air as $n suddenly drops out of sight!",
                 &ch_local,&local_238,&local_240,&local_244);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"verb_prog_antava_touch_hand",(allocator<char> *)&local_240);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"WAIT_STATE",(allocator<char> *)&local_244);
      local_238 = (void *)CONCAT44(local_238._4_4_,0x3c);
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int>
                (&RS.Queue,2,&local_200,&local_220,WAIT_STATE,&ch_local,(int *)&local_238);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      return;
    }
    txt = "You can\'t reach it while you\'re sitting down.\n\r";
  }
  else {
    txt = "You\'re too busy fighting to do that!\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void verb_prog_antava_touch_hand(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *tomb = get_room_index(102);

	if (ch->in_room->vnum != 462)
		return;

	if (ch->fighting)
	{
		send_to_char("You're too busy fighting to do that!\n\r", ch);
		return;
	}

	if (ch->position <= POS_SITTING)
	{
		send_to_char("You can't reach it while you're sitting down.\n\r", ch);
		return;
	}

	act("You touch the hand of the decaying statue.", ch, 0, 0, TO_CHAR);
	act("$n reaches up and touches the hand of the decaying statue.", ch, 0, 0, TO_ROOM);
	act("A rusty clicking noise begins to sound from within the statue.", 0, 0, 0, TO_ROOM);

	if (ch->in_room->vnum != 462)
		return;

	RS.Queue.AddToQueue(14,"verb_prog_antava_touch_hand", "act_queue", act_queue, "Darkness closes back in upon the antechamber as the stone above you shuts abruptly!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "do_look_queue", do_look_queue, ch, "auto");
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "$n suddenly slides down from above!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_to_room", char_to_room, ch, tomb);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "char_from_room", char_from_room, ch);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "You suddenly feel the ground drop out from under you!", ch, nullptr, nullptr, TO_CHAR);
	RS.Queue.AddToQueue(9, "verb_prog_antava_touch_hand", "act_queue", act_queue, "The sound of grinding granite fills the air as $n suddenly drops out of sight!", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(2, "verb_prog_antava_touch_hand", "WAIT_STATE", WAIT_STATE, ch, PULSE_VIOLENCE * 5);
}